

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall pbrt::ThinDielectricMaterial::ToString_abi_cxx11_(ThinDielectricMaterial *this)

{
  long in_RSI;
  string *in_RDI;
  Image *in_stack_00000008;
  Spectrum *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  byte bVar1;
  allocator<char> in_stack_ffffffffffffffcf;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = 0;
  if (*(long *)(in_RSI + 8) == 0) {
    std::allocator<char>::allocator();
    bVar1 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  else {
    Image::ToString_abi_cxx11_(in_stack_00000008);
  }
  StringPrintf<pbrt::FloatTexture_const&,std::__cxx11::string,pbrt::Spectrum_const&>
            (in_stack_ffffffffffffffd8,(FloatTexture *)in_stack_ffffffffffffffd0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffcf,CONCAT16(bVar1,in_stack_ffffffffffffffc8)),
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  return in_RDI;
}

Assistant:

std::string ThinDielectricMaterial::ToString() const {
    return StringPrintf(
        "[ ThinDielectricMaterial displacement: %s normalMap: %s eta: %s ]", displacement,
        normalMap ? normalMap->ToString() : std::string("(nullptr)"), eta);
}